

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

int __thiscall
embree::QuadMesh::verify
          (QuadMesh *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  BufferView<embree::Vec3fa> *pBVar1;
  float *pfVar2;
  uint uVar3;
  ulong uVar4;
  char *pcVar5;
  undefined1 auVar6 [16];
  RawBufferView *pRVar7;
  iterator __begin1;
  BufferView<embree::Vec3fa> *pBVar8;
  long lVar9;
  size_t i;
  BufferView<embree::Vec3fa> *pBVar10;
  uint *puVar11;
  size_t sVar12;
  undefined4 uVar13;
  
  sVar12 = (this->vertices).size_active;
  if (sVar12 != 0) {
    pBVar8 = (this->vertices).items;
    lVar9 = sVar12 * 0x38;
    pBVar1 = pBVar8 + sVar12;
    pBVar10 = pBVar8;
    do {
      if (lVar9 == 0) {
        lVar9 = (ulong)(this->super_Geometry).numPrimitives + 1;
        puVar11 = (uint *)(*(long *)&(this->super_Geometry).field_0x58 + 0xc);
        while( true ) {
          lVar9 = lVar9 + -1;
          if (lVar9 == 0) {
            do {
              if (pBVar8 == pBVar1) {
                return (int)CONCAT71((int7)((ulong)pBVar8 >> 8),1);
              }
              sVar12 = 0;
              while ((pBVar8->super_RawBufferView).num != sVar12) {
                pcVar5 = (pBVar8->super_RawBufferView).ptr_ofs;
                pfVar2 = (float *)(pcVar5 + (pBVar8->super_RawBufferView).stride * sVar12);
                auVar6._4_4_ = -(uint)(pfVar2[1] < 1.844e+18 && -1.844e+18 < pfVar2[1]);
                auVar6._0_4_ = -(uint)(*pfVar2 < 1.844e+18 && -1.844e+18 < *pfVar2);
                auVar6._8_4_ = -(uint)(pfVar2[2] < 1.844e+18 && -1.844e+18 < pfVar2[2]);
                auVar6._12_4_ = -(uint)(pfVar2[3] < 1.844e+18 && -1.844e+18 < pfVar2[3]);
                uVar13 = movmskps((int)pcVar5,auVar6);
                sVar12 = sVar12 + 1;
                if ((~(byte)uVar13 & 7) != 0) {
                  return 0;
                }
              }
              pBVar8 = pBVar8 + 1;
            } while( true );
          }
          uVar4 = (pBVar8->super_RawBufferView).num;
          if (uVar4 <= puVar11[-3]) {
            return 0;
          }
          if (uVar4 <= puVar11[-2]) {
            return 0;
          }
          if (uVar4 <= puVar11[-1]) break;
          uVar3 = *puVar11;
          puVar11 = (uint *)((long)puVar11 + *(long *)&this->field_0x68);
          if (uVar4 <= uVar3) {
            return 0;
          }
        }
        return 0;
      }
      pRVar7 = &pBVar10->super_RawBufferView;
      pBVar10 = pBVar10 + 1;
      lVar9 = lVar9 + -0x38;
    } while (pRVar7->num == (pBVar8->super_RawBufferView).num);
  }
  return 0;
}

Assistant:

__forceinline size_t size     () const { return size_active; }